

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O0

NvmlHealth * xmrig::NvmlLib::health(nvmlDevice_t device)

{
  int iVar1;
  ulong extraout_RDX;
  ulong uVar2;
  long in_RSI;
  NvmlHealth *in_RDI;
  uint32_t i;
  uint32_t speed;
  NvmlHealth *health;
  NvmlHealth *pNVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  undefined4 local_28 [5];
  undefined1 local_11;
  long local_10;
  
  pNVar3 = in_RDI;
  if (in_RSI == 0) {
    memset(in_RDI,0,0x28);
    NvmlHealth::NvmlHealth(in_RDI);
  }
  else {
    local_11 = 0;
    local_10 = in_RSI;
    NvmlHealth::NvmlHealth(in_RDI);
    (*pNvmlDeviceGetTemperature)(local_10,0,&in_RDI->temperature);
    (*pNvmlDeviceGetPowerUsage)(local_10,&in_RDI->power);
    (*pNvmlDeviceGetClockInfo)(local_10,1,&in_RDI->clock);
    (*pNvmlDeviceGetClockInfo)(local_10,2,&in_RDI->memClock);
    uVar2 = extraout_RDX;
    if (in_RDI->power != 0) {
      uVar2 = (ulong)in_RDI->power % 1000;
      in_RDI->power = in_RDI->power / 1000;
    }
    local_28[0] = 0;
    if (pNvmlDeviceGetFanSpeed_v2 == (code *)0x0) {
      (*pNvmlDeviceGetFanSpeed)(local_10,local_28,uVar2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (value_type_conflict3 *)pNVar3);
    }
    else {
      iVar4 = 0;
      while (iVar1 = (*pNvmlDeviceGetFanSpeed_v2)(local_10,iVar4,local_28), iVar1 == 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(iVar4,in_stack_ffffffffffffffd0),(value_type_conflict3 *)pNVar3);
        iVar4 = iVar4 + 1;
      }
    }
  }
  return pNVar3;
}

Assistant:

NvmlHealth xmrig::NvmlLib::health(nvmlDevice_t device)
{
    if (!device) {
        return {};
    }

    NvmlHealth health;
    pNvmlDeviceGetTemperature(device, NVML_TEMPERATURE_GPU, &health.temperature);
    pNvmlDeviceGetPowerUsage(device, &health.power);
    pNvmlDeviceGetClockInfo(device, NVML_CLOCK_SM, &health.clock);
    pNvmlDeviceGetClockInfo(device, NVML_CLOCK_MEM, &health.memClock);

    if (health.power) {
        health.power /= 1000;
    }

    uint32_t speed = 0;

    if (pNvmlDeviceGetFanSpeed_v2) {
        uint32_t i = 0;

        while (pNvmlDeviceGetFanSpeed_v2(device, i, &speed) == NVML_SUCCESS) {
            health.fanSpeed.push_back(speed);
            ++i;
        }

    }
    else {
        pNvmlDeviceGetFanSpeed(device, &speed);

        health.fanSpeed.push_back(speed);
    }

    return health;
}